

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

void __thiscall
wasm::WATParser::ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
          (ParseImplicitTypeDefsCtx *this,Lexer *in,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes,IndexMap *typeIndices)

{
  _Alloc_hider _Var1;
  pointer pHVar2;
  char *pcVar3;
  bool bVar4;
  HeapTypeKind HVar5;
  Shareability SVar6;
  RecGroup RVar7;
  size_t sVar8;
  __hashtable *__h;
  pointer pHVar9;
  optional<wasm::HeapType> oVar10;
  Signature local_58;
  uintptr_t local_48;
  Lexer *local_40;
  HeapType local_38;
  HeapType type;
  
  (this->super_TypeParserCtx<wasm::WATParser::ParseImplicitTypeDefsCtx>).typeIndices = typeIndices;
  (this->in).pos = in->pos;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            (&(this->in).annotations,&in->annotations);
  (this->in).file.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  if ((in->file).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    (this->in).file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         ((pointer)
         ((long)&(this->in).file.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x10))._M_p;
    _Var1._M_p = (in->file).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(this->in).file,_Var1._M_p,
               _Var1._M_p +
               (in->file).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
    (this->in).file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
  pcVar3 = (in->buffer)._M_str;
  (this->in).buffer._M_len = (in->buffer)._M_len;
  (this->in).buffer._M_str = pcVar3;
  this->types = types;
  this->implicitTypes = implicitTypes;
  (this->sigTypes)._M_h._M_buckets = &(this->sigTypes)._M_h._M_single_bucket;
  (this->sigTypes)._M_h._M_bucket_count = 1;
  (this->sigTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sigTypes)._M_h._M_element_count = 0;
  (this->sigTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sigTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sigTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pHVar9 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar9 != pHVar2) {
    local_40 = &this->in;
    do {
      local_38.id = pHVar9->id;
      HVar5 = HeapType::getKind(&local_38);
      if (HVar5 == Func) {
        RVar7 = HeapType::getRecGroup(&local_38);
        local_58.params.id = RVar7.id;
        sVar8 = RecGroup::size((RecGroup *)&local_58);
        if (sVar8 == 1) {
          oVar10 = HeapType::getDeclaredSuperType(&local_38);
          if (((undefined1  [16])
               oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            bVar4 = HeapType::isOpen(&local_38);
            if (!bVar4) {
              SVar6 = HeapType::getShared(&local_38);
              if (SVar6 != Shared) {
                local_58 = HeapType::getSignature(&local_38);
                local_48 = local_38.id;
                std::
                _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::pair<wasm::Signature_const,wasm::HeapType>>
                          ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,wasm::HeapType>,std::allocator<std::pair<wasm::Signature_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->sigTypes,&local_58);
              }
            }
          }
        }
      }
      pHVar9 = pHVar9 + 1;
    } while (pHVar9 != pHVar2);
  }
  return;
}

Assistant:

ParseImplicitTypeDefsCtx(Lexer& in,
                           std::vector<HeapType>& types,
                           std::unordered_map<Index, HeapType>& implicitTypes,
                           const IndexMap& typeIndices)
    : TypeParserCtx<ParseImplicitTypeDefsCtx>(typeIndices), in(in),
      types(types), implicitTypes(implicitTypes) {
    for (auto type : types) {
      if (type.isSignature() && type.getRecGroup().size() == 1 &&
          !type.getDeclaredSuperType() && !type.isOpen() && !type.isShared()) {
        sigTypes.insert({type.getSignature(), type});
      }
    }
  }